

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::DoSimdShift<long,long>(Thread *this,BinopFunc<long,_long> *f)

{
  uint uVar1;
  long lVar2;
  u8 i;
  long lVar3;
  Simd<long,_(unsigned_char)__x02_> SVar4;
  SR result;
  Simd<long,_(unsigned_char)__x02_> lhs;
  Simd<long,_(unsigned_char)__x02_> local_48;
  long local_38 [2];
  
  uVar1 = Pop<unsigned_int>(this);
  SVar4 = Pop<wabt::interp::Simd<long,(unsigned_char)2>>(this);
  local_38[0] = SVar4.v[0];
  local_38[1] = SVar4.v[1];
  lVar3 = 0;
  do {
    lVar2 = (*f)(local_38[lVar3],(long)uVar1);
    local_48.v[lVar3] = lVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  Push<wabt::interp::Simd<long,(unsigned_char)2>>(this,local_48);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdShift(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto amount = Pop<u32>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result[i] = f(lhs[i], amount);
  }
  Push(result);
  return RunResult::Ok;
}